

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::CurrencySymbols::CurrencySymbols
          (CurrencySymbols *this,CurrencyUnit *currency,Locale *locale,UErrorCode *status)

{
  StringPiece s;
  undefined1 local_38 [12];
  
  CurrencyUnit::CurrencyUnit(&this->fCurrency,currency);
  StringPiece::StringPiece((StringPiece *)local_38,locale->fullName);
  s._12_4_ = 0;
  s.ptr_ = (char *)local_38._0_8_;
  s.length_ = local_38._8_4_;
  CharString::CharString(&this->fLocaleName,s,status);
  (this->fCurrencySymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fCurrencySymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fIntlCurrencySymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fIntlCurrencySymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&this->fCurrencySymbol);
  UnicodeString::setToBogus(&this->fIntlCurrencySymbol);
  return;
}

Assistant:

CurrencySymbols::CurrencySymbols(CurrencyUnit currency, const Locale& locale, UErrorCode& status)
        : fCurrency(currency), fLocaleName(locale.getName(), status) {
    fCurrencySymbol.setToBogus();
    fIntlCurrencySymbol.setToBogus();
}